

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_limit.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bandwidth_channel::update_quota(bandwidth_channel *this,int dt_milliseconds)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)this->m_limit;
  if (lVar4 != 0) {
    lVar2 = (dt_milliseconds * lVar4 + 500) / 1000;
    lVar3 = 0x7fffffff;
    if (lVar2 <= 0x7fffffff - this->m_quota_left) {
      lVar2 = this->m_quota_left + lVar2;
      lVar3 = lVar4 * 3;
      if (lVar2 / 3 <= lVar4) {
        lVar3 = lVar2;
      }
      if (0x7ffffffe < lVar3) {
        lVar3 = 0x7fffffff;
      }
    }
    this->m_quota_left = lVar3;
    iVar1 = 0;
    if (0 < lVar3) {
      iVar1 = (int)lVar3;
    }
    this->distribute_quota = iVar1;
  }
  return;
}

Assistant:

void bandwidth_channel::update_quota(int const dt_milliseconds)
	{
		TORRENT_ASSERT_VAL(m_limit >= 0, m_limit);
		TORRENT_ASSERT_VAL(m_limit < inf, m_limit);

		if (m_limit == 0) return;

		// "to_add" should never have int64 overflow: "m_limit" contains < "<int>::max"
		std::int64_t const to_add = (std::int64_t(m_limit) * dt_milliseconds + 500) / 1000;

		if (to_add > inf - m_quota_left)
		{
			m_quota_left = inf;
		}
		else
		{
			m_quota_left += to_add;
			if (m_quota_left / 3 > m_limit) m_quota_left = std::int64_t(m_limit) * 3;
			// "m_quota_left" will never have int64 overflow but may exceed "<int>::max"
			m_quota_left = std::min(m_quota_left, std::int64_t(inf));
		}

		distribute_quota = int(std::max(m_quota_left, std::int64_t(0)));
	}